

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O0

MPP_RET reader_index_read(FileReader reader,RK_S32 index,FileBufSlot **buf)

{
  FileBufSlot *pFVar1;
  FileBufSlot *slot;
  FileReaderImpl *impl;
  FileBufSlot **buf_local;
  RK_S32 index_local;
  FileReader reader_local;
  
  if ((reader == (FileReader)0x0) || (*(long *)((long)reader + 0x70) == 0)) {
    _mpp_log_l(4,"mpi_dec_utils","invalid reader %p\n","reader_index_read",reader);
    reader_local._4_4_ = MPP_NOK;
  }
  else if (index < *(int *)((long)reader + 100)) {
    while (pFVar1 = *(FileBufSlot **)(*(long *)((long)reader + 0x70) + (long)index * 8),
          pFVar1 == (FileBufSlot *)0x0) {
      usleep(1000);
    }
    if ((pFVar1 == (FileBufSlot *)0x0) &&
       (_mpp_log_l(2,"mpi_dec_utils","Assertion %s failed at %s:%d\n",0,"slot","reader_index_read",
                   0x130), (_mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    *buf = pFVar1;
    reader_local._4_4_ = MPP_OK;
  }
  else {
    _mpp_log_l(4,"mpi_dec_utils","invalid read index % max %d\n","reader_index_read",index,
               *(undefined4 *)((long)reader + 100));
    reader_local._4_4_ = MPP_NOK;
  }
  return reader_local._4_4_;
}

Assistant:

MPP_RET reader_index_read(FileReader reader, RK_S32 index, FileBufSlot **buf)
{
    FileReaderImpl *impl = (FileReaderImpl*)reader;
    FileBufSlot *slot = NULL;

    if (NULL == impl || NULL == impl->slots) {
        mpp_log_f("invalid reader %p\n", reader);
        return MPP_NOK;
    }

    if (index >= (RK_S32)impl->slot_max) {
        mpp_log_f("invalid read index % max %d\n", index, impl->slot_max);
        return MPP_NOK;
    }

    do {
        slot = impl->slots[index];
        if (slot == NULL)
            msleep(1);
    } while (slot == NULL);

    mpp_assert(slot);

    *buf  = slot;

    return MPP_OK;
}